

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O2

QMimeData * __thiscall QTreeModel::mimeData(QTreeModel *this,QModelIndexList *indexes)

{
  QTreeWidgetItem *t;
  iterator iVar1;
  iterator iVar2;
  QTreeWidget *pQVar3;
  QMimeData *pQVar4;
  QTreeModel *this_00;
  QModelIndex *index;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  QTreeWidgetItem *local_38;
  QTreeWidgetItem *local_30;
  
  local_30 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  local_38 = (QTreeWidgetItem *)0x0;
  local_48._0_8_ = (Data *)0x0;
  local_48._8_8_ = (QTreeWidgetItem **)0x0;
  index = (indexes->d).ptr;
  this_00 = this;
  for (lVar5 = (indexes->d).size * 0x18; lVar5 != 0; lVar5 = lVar5 + -0x18) {
    t = item(this_00,index);
    this_00 = (QTreeModel *)local_48;
    QList<QTreeWidgetItem_*>::append((QList<QTreeWidgetItem_*> *)local_48,t);
    index = index + 1;
  }
  iVar1 = QList<QTreeWidgetItem_*>::begin((QList<QTreeWidgetItem_*> *)local_48);
  iVar2 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)local_48);
  std::__sort<QList<QTreeWidgetItem*>::iterator,__gnu_cxx::__ops::_Iter_less_iter>(iVar1.i,iVar2.i);
  iVar1 = QList<QTreeWidgetItem_*>::begin((QList<QTreeWidgetItem_*> *)local_48);
  iVar2 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)local_48);
  iVar1 = std::__unique<QList<QTreeWidgetItem*>::iterator,__gnu_cxx::__ops::_Iter_equal_to_iter>
                    (iVar1.i,iVar2.i);
  iVar2 = QList<QTreeWidgetItem_*>::end((QList<QTreeWidgetItem_*> *)local_48);
  QList<QTreeWidgetItem_*>::erase
            ((QList<QTreeWidgetItem_*> *)local_48,(const_iterator)iVar1.i,(const_iterator)iVar2.i);
  QArrayDataPointer<QModelIndex>::operator=(&(this->cachedIndexes).d,&indexes->d);
  pQVar3 = view(this);
  pQVar4 = (QMimeData *)
           (**(code **)(*(long *)&(pQVar3->super_QTreeView).super_QAbstractItemView.
                                  super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x318))
                     (pQVar3,local_48);
  QList<QModelIndex>::clear(&this->cachedIndexes);
  QArrayDataPointer<QTreeWidgetItem_*>::~QArrayDataPointer
            ((QArrayDataPointer<QTreeWidgetItem_*> *)local_48);
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) == local_30) {
    return pQVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMimeData *QTreeModel::mimeData(const QModelIndexList &indexes) const
{
    QList<QTreeWidgetItem *> items;
    std::transform(indexes.begin(), indexes.end(), std::back_inserter(items),
                   [this](const QModelIndex &idx) -> QTreeWidgetItem * { return item(idx); });

    // Ensure we only have one item as an item may have more than
    // one index selected if there is more than one column
    std::sort(items.begin(), items.end());
    items.erase(std::unique(items.begin(), items.end()), items.end());

    // cachedIndexes is a little hack to avoid copying from QModelIndexList to
    // QList<QTreeWidgetItem*> and back again in the view
    cachedIndexes = indexes;
    QMimeData *mimeData = view()->mimeData(items);
    cachedIndexes.clear();
    return mimeData;
}